

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunScriptCommand.h
# Opt level: O0

cmCommand * __thiscall cmCTestRunScriptCommand::Clone(cmCTestRunScriptCommand *this)

{
  cmCommand *this_00;
  cmCTestRunScriptCommand *ni;
  cmCTestRunScriptCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x60);
  cmCTestRunScriptCommand((cmCTestRunScriptCommand *)this_00);
  this_00[1].super_cmObject._vptr_cmObject = (_func_int **)(this->super_cmCTestCommand).CTest;
  this_00[1].Makefile = (cmMakefile *)(this->super_cmCTestCommand).CTestScriptHandler;
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    cmCTestRunScriptCommand* ni = new cmCTestRunScriptCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
    }